

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O1

int __thiscall cab_manager::remove(cab_manager *this,char *__filename)

{
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  pointer pwVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  long lVar6;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it;
  cab_manager *pcVar7;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  __it_00;
  node_type pos;
  node_type local_49;
  cab_manager *local_48;
  key_type *local_40;
  key_type local_34;
  
  local_34 = (key_type)__filename;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_34);
  local_49 = cab::position((pmVar3->super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this_00 = &this->_cabs_at_node;
  local_48 = this;
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_49);
  __it_00._M_current =
       (pmVar4->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_49);
  pwVar1 = (pmVar4->super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pwVar1 - (long)__it_00._M_current >> 6;
  local_40 = &local_34;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                        ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,__it_00);
      __it._M_current = __it_00._M_current;
      pcVar7 = local_48;
      if (bVar2) goto LAB_0011e41d;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                        ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,
                         __it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      pcVar7 = local_48;
      if (bVar2) goto LAB_0011e41d;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                        ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,
                         __it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      pcVar7 = local_48;
      if (bVar2) goto LAB_0011e41d;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                        ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,
                         __it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      pcVar7 = local_48;
      if (bVar2) goto LAB_0011e41d;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  pcVar7 = local_48;
  lVar6 = (long)pwVar1 - (long)__it_00._M_current >> 4;
  if (lVar6 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar6 != 2) {
      __it._M_current = pwVar1;
      if ((lVar6 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                            ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,__it_00
                            ), __it._M_current = __it_00._M_current, bVar2)) goto LAB_0011e41d;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                      ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,__it);
    if (bVar2) goto LAB_0011e41d;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<cab_manager::remove(unsigned_int)::$_0>::operator()
                    ((_Iter_pred<cab_manager::remove(unsigned_int)::__0> *)&local_40,__it_00);
  __it._M_current = pwVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_0011e41d:
  pmVar4 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,&local_49);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::_M_erase
            (pmVar4,(iterator)__it._M_current);
  sVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<cab>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pcVar7,&local_34);
  return (int)sVar5;
}

Assistant:

void cab_manager::remove(id_type id)
{
    node_type pos = _cabs[id]->position();
    auto it = std::find_if(_cabs_at_node[pos].begin(), _cabs_at_node[pos].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[pos].erase(it);
    _cabs.erase(id);
}